

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  uint *puVar6;
  char *pcVar7;
  FILE *pFVar8;
  ulong uVar9;
  timeval tVar10;
  undefined8 uStack_1f0;
  int running;
  long local_1e0;
  int maxfd;
  double local_1d0;
  double connect_time;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  connect_time = 0.0;
  running = 1;
  local_1d0 = 1.0;
  do {
    local_1d0 = local_1d0 * 0.5;
  } while (1.0 < local_1d0 * 0.5 + 1.0);
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar8 = _stderr;
  if (uVar1 != 0) {
    uVar5 = curl_easy_strerror(uVar1);
    fprintf(pFVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
            ,0x33,(ulong)uVar1,uVar5);
    goto LAB_001028a9;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
            ,0x35);
    uVar1 = 0x7c;
    goto LAB_00102889;
  }
  uVar1 = curl_easy_setopt(lVar3,0x2a,1);
  pFVar8 = _stderr;
  if (uVar1 == 0) {
    uVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    pFVar8 = _stderr;
    if (uVar1 != 0) {
      uVar9 = (ulong)uVar1;
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1f0 = 0x38;
      goto LAB_0010274d;
    }
    libtest_debug_config.tracetime = 1;
    libtest_debug_config.nohex = 1;
    uVar1 = curl_easy_setopt(lVar3,0x276f);
    pFVar8 = _stderr;
    if (uVar1 != 0) {
      uVar9 = (ulong)uVar1;
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1f0 = 0x3c;
      goto LAB_0010274d;
    }
    uVar1 = curl_easy_setopt(lVar3,0x4e7e,libtest_debug_cb);
    pFVar8 = _stderr;
    if (uVar1 != 0) {
      uVar9 = (ulong)uVar1;
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1f0 = 0x3d;
      goto LAB_0010274d;
    }
    uVar1 = curl_easy_setopt(lVar3,0x29,1);
    pFVar8 = _stderr;
    if (uVar1 != 0) {
      uVar9 = (ulong)uVar1;
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1f0 = 0x3e;
      goto LAB_0010274d;
    }
    lVar4 = curl_multi_init();
    if (lVar4 == 0) {
      lVar4 = 0;
      fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
              ,0x40);
      uVar1 = 0x7b;
    }
    else {
      uVar1 = curl_multi_add_handle(lVar4,lVar3);
      pFVar8 = _stderr;
      if (uVar1 != 0) {
        uVar9 = (ulong)uVar1;
        uVar5 = curl_multi_strerror(uVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1f0 = 0x42;
        goto LAB_0010274d;
      }
      local_1e0 = lVar3;
      iVar2 = 1;
      do {
        if (iVar2 == 0) {
LAB_00102576:
          lVar3 = local_1e0;
          uVar1 = 0;
          curl_easy_getinfo(local_1e0,0x300005,&connect_time);
          if (connect_time < local_1d0) {
            fwrite("connect time is < epsilon\n",0x1a,1,_stderr);
            uVar1 = 0x7e;
          }
          goto LAB_00102889;
        }
        maxfd = -99;
        timeout.tv_sec = 0;
        timeout.tv_usec = 100000;
        uVar1 = curl_multi_perform(lVar4,&running);
        pFVar8 = _stderr;
        if (uVar1 != 0) {
          uVar5 = curl_multi_strerror(uVar1);
          pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1f0 = 0x4c;
LAB_001027e6:
          fprintf(pFVar8,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                  ,uStack_1f0,(ulong)uVar1,uVar5);
          lVar3 = local_1e0;
          goto LAB_00102889;
        }
        if (running < 0) {
          pcVar7 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1f0 = 0x4c;
LAB_00102816:
          fprintf(_stderr,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                  ,uStack_1f0);
          uVar1 = 0x7a;
          lVar3 = local_1e0;
          goto LAB_00102889;
        }
        tVar10 = tutil_tvnow();
        lVar3 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar3) {
          uStack_1f0 = 0x4e;
          goto LAB_00102879;
        }
        if (running == 0) goto LAB_00102576;
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdread.__fds_bits[lVar3] = 0;
        }
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdwrite.__fds_bits[lVar3] = 0;
        }
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdexcep.__fds_bits[lVar3] = 0;
        }
        uVar1 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
        pFVar8 = _stderr;
        if (uVar1 != 0) {
          uVar5 = curl_multi_strerror(uVar1);
          pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1f0 = 0x57;
          goto LAB_001027e6;
        }
        if (maxfd < -1) {
          pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1f0 = 0x57;
          goto LAB_00102816;
        }
        iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
        if (iVar2 == -1) {
          puVar6 = (uint *)__errno_location();
          pFVar8 = _stderr;
          uVar1 = *puVar6;
          pcVar7 = strerror(uVar1);
          fprintf(pFVar8,"%s:%d select() failed, with errno %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                  ,0x5b,(ulong)uVar1,pcVar7);
          uVar1 = 0x79;
          lVar3 = local_1e0;
          goto LAB_00102889;
        }
        tVar10 = tutil_tvnow();
        lVar3 = tutil_tvdiff(tVar10,tv_test_start);
        iVar2 = running;
      } while (lVar3 < 0xea61);
      uStack_1f0 = 0x5d;
LAB_00102879:
      fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
              ,uStack_1f0);
      uVar1 = 0x7d;
      lVar3 = local_1e0;
    }
  }
  else {
    uVar9 = (ulong)uVar1;
    uVar5 = curl_easy_strerror(uVar1);
    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar4 = 0;
    uStack_1f0 = 0x37;
LAB_0010274d:
    uVar1 = (uint)uVar9;
    fprintf(pFVar8,pcVar7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
            ,uStack_1f0,uVar9,uVar5);
  }
LAB_00102889:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_001028a9:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while ((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while (running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if (connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time is < epsilon\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}